

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O0

array<pbrt::Point3<float>,_4> * pbrt::CubicBSplineToBezier(span<const_pbrt::Point3<float>_> cp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  initializer_list<pbrt::Point3<float>_> v;
  Tuple3<pbrt::Point3,_float> t1;
  Tuple3<pbrt::Point3,_float> t1_00;
  Tuple3<pbrt::Point3,_float> t1_01;
  Tuple3<pbrt::Point3,_float> t1_02;
  Tuple3<pbrt::Point3,_float> t1_03;
  Tuple3<pbrt::Point3,_float> t1_04;
  Tuple3<pbrt::Point3,_float> t0;
  Tuple3<pbrt::Point3,_float> t0_00;
  Tuple3<pbrt::Point3,_float> t0_01;
  Tuple3<pbrt::Point3,_float> t0_02;
  Tuple3<pbrt::Point3,_float> t0_03;
  Tuple3<pbrt::Point3,_float> t0_04;
  array<pbrt::Point3<float>,_4> *in_RDI;
  iterator pPVar6;
  undefined8 uVar10;
  undefined1 auVar13 [56];
  undefined1 auVar7 [64];
  undefined8 uVar11;
  undefined1 auVar8 [64];
  size_type sVar12;
  undefined1 auVar9 [64];
  Point3<float> PVar14;
  Point3<float> PVar15;
  Point3<float> PVar16;
  Point3<float> PVar17;
  Point3f p333;
  Point3f p222;
  Point3f p334;
  Point3f p233;
  Point3f p223;
  Point3f p122;
  Point3f p345;
  Point3f p234;
  Point3f p123;
  Point3f p012;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 uVar18;
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2bc;
  float local_2b4;
  undefined8 local_2b0;
  float local_2a8;
  undefined8 local_2a4;
  float local_29c;
  undefined8 *local_298;
  undefined8 in_stack_fffffffffffffd70;
  Float t;
  undefined8 in_stack_fffffffffffffd88;
  float in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffda8;
  float in_stack_fffffffffffffdb0;
  span<const_pbrt::Point3<float>_> local_10;
  
  t = (Float)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  pstd::span<const_pbrt::Point3<float>_>::operator[](&local_10,0);
  pstd::span<const_pbrt::Point3<float>_>::operator[](&local_10,1);
  pstd::span<const_pbrt::Point3<float>_>::operator[](&local_10,2);
  pstd::span<const_pbrt::Point3<float>_>::operator[](&local_10,3);
  auVar13 = (undefined1  [56])0x0;
  t0.z = in_stack_fffffffffffffdb0;
  t0.x = (float)(int)in_stack_fffffffffffffda8;
  t0.y = (float)(int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  t1.z = in_stack_fffffffffffffd90;
  t1.x = (float)(int)in_stack_fffffffffffffd88;
  t1.y = (float)(int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  PVar14 = Lerp<pbrt::Point3,float>(t,t0,t1);
  auVar7._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar13;
  vmovlpd_avx(auVar7._0_16_);
  uVar10 = 0;
  t0_00.z = in_stack_fffffffffffffdb0;
  t0_00.x = (float)(int)in_stack_fffffffffffffda8;
  t0_00.y = (float)(int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  t1_00.z = in_stack_fffffffffffffd90;
  t1_00.x = (float)(int)in_stack_fffffffffffffd88;
  t1_00.y = (float)(int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  PVar14 = Lerp<pbrt::Point3,float>(t,t0_00,t1_00);
  uVar11 = 0;
  auVar3._8_8_ = uVar10;
  auVar3._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  uVar10 = vmovlpd_avx(auVar3);
  t0_01.z = in_stack_fffffffffffffdb0;
  t0_01.x = (float)(int)in_stack_fffffffffffffda8;
  t0_01.y = (float)(int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  t1_01.z = in_stack_fffffffffffffd90;
  t1_01.x = (float)(int)in_stack_fffffffffffffd88;
  t1_01.y = (float)(int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  PVar15 = Lerp<pbrt::Point3,float>(t,t0_01,t1_01);
  auVar13 = (undefined1  [56])0x0;
  auVar4._8_8_ = uVar11;
  auVar4._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  uVar11 = vmovlpd_avx(auVar4);
  t0_02.z = in_stack_fffffffffffffdb0;
  t0_02.x = (float)(int)in_stack_fffffffffffffda8;
  t0_02.y = (float)(int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  t1_02.z = in_stack_fffffffffffffd90;
  t1_02.x = (float)(int)in_stack_fffffffffffffd88;
  t1_02.y = (float)(int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  PVar16 = Lerp<pbrt::Point3,float>(t,t0_02,t1_02);
  auVar8._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar13;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  sVar12 = 0;
  uVar18 = 0x3f000000;
  t0_03.z = in_stack_fffffffffffffdb0;
  t0_03.x = (float)(int)in_stack_fffffffffffffda8;
  t0_03.y = (float)(int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  t1_03.z = in_stack_fffffffffffffd90;
  t1_03.x = (float)(int)in_stack_fffffffffffffd88;
  t1_03.y = (float)(int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  PVar17 = Lerp<pbrt::Point3,float>(t,t0_03,t1_03);
  pPVar6 = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar13 = (undefined1  [56])0x0;
  auVar5._8_8_ = sVar12;
  auVar5._0_8_ = pPVar6;
  uVar2 = vmovlpd_avx(auVar5);
  t0_04.z = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  t0_04.x = (float)(int)uVar1;
  t0_04.y = (float)(int)((ulong)uVar1 >> 0x20);
  t1_04.z = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  t1_04.x = (float)(int)uVar1;
  t1_04.y = (float)(int)((ulong)uVar1 >> 0x20);
  PVar16 = Lerp<pbrt::Point3,float>(t,t0_04,t1_04);
  local_29c = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar13;
  local_2a4 = vmovlpd_avx(auVar9._0_16_);
  local_298 = &local_2c8;
  v._M_len = sVar12;
  v._M_array = pPVar6;
  local_2c8 = uVar2;
  local_2c0 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  local_2bc = uVar10;
  local_2b4 = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  local_2b0 = uVar11;
  local_2a8 = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  pstd::array<pbrt::Point3<float>,_4>::array
            ((array<pbrt::Point3<float>,_4> *)CONCAT44(uVar18,in_stack_fffffffffffffd10),v);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU inline pstd::array<Point3f, 4> CubicBSplineToBezier(
    pstd::span<const Point3f> cp) {
    // Blossom from p012, p123, p234, and p345 to the Bezier control points
    // p222, p223, p233, and p333.
    // https://people.eecs.berkeley.edu/~sequin/CS284/IMGS/cubicbsplinepoints.gif
    Point3f p012 = cp[0], p123 = cp[1], p234 = cp[2], p345 = cp[3];

    Point3f p122 = Lerp(2.f / 3.f, p012, p123);
    Point3f p223 = Lerp(1.f / 3.f, p123, p234);
    Point3f p233 = Lerp(2.f / 3.f, p123, p234);
    Point3f p334 = Lerp(1.f / 3.f, p234, p345);

    Point3f p222 = Lerp(0.5f, p122, p223);
    Point3f p333 = Lerp(0.5f, p233, p334);

    return {p222, p223, p233, p333};
}